

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O1

int __thiscall Dashel::Hub::connect(Hub *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  Stream *pSVar4;
  long *plVar5;
  DashelException *pDVar6;
  undefined4 in_register_00000034;
  pair<std::_Rb_tree_iterator<Dashel::Stream_*>,_bool> pVar7;
  string r;
  string proto;
  Stream *local_80 [2];
  undefined1 local_70 [16];
  string local_60;
  string local_40;
  
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = local_70 + 0x20;
  lVar3 = std::__cxx11::string::find((char)__fd,0x3a);
  if (lVar3 == -1) {
    pDVar6 = (DashelException *)__cxa_allocate_exception(0x20);
    DashelException::DashelException
              (pDVar6,InvalidTarget,0,"No protocol specified in target.",(Stream *)0x0);
    __cxa_throw(pDVar6,&DashelException::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::substr((ulong)local_80,CONCAT44(in_register_00000034,__fd));
  std::__cxx11::string::operator=((string *)(local_70 + 0x10),(string *)local_80);
  if (local_80[0] != (Stream *)local_70) {
    operator_delete(local_80[0],local_70._0_8_ + 1);
  }
  pSVar4 = StreamTypeRegistry::create
                     ((StreamTypeRegistry *)streamTypeRegistry,(string *)(local_70 + 0x10),
                      (string *)CONCAT44(in_register_00000034,__fd),this);
  if (pSVar4 == (Stream *)0x0) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = (long *)__dynamic_cast(pSVar4,&Stream::typeinfo,&SelectableStream::typeinfo,
                                    0xffffffffffffffff);
  }
  if (plVar5 != (long *)0x0) {
    local_80[0] = (Stream *)(*(long *)(*plVar5 + -0x18) + (long)plVar5);
    std::
    _Rb_tree<Dashel::Stream*,Dashel::Stream*,std::_Identity<Dashel::Stream*>,std::less<Dashel::Stream*>,std::allocator<Dashel::Stream*>>
    ::_M_insert_unique<Dashel::Stream*>
              ((_Rb_tree<Dashel::Stream*,Dashel::Stream*,std::_Identity<Dashel::Stream*>,std::less<Dashel::Stream*>,std::allocator<Dashel::Stream*>>
                *)&this->streams,local_80);
    iVar2 = std::__cxx11::string::compare(local_70 + 0x10);
    if (iVar2 != 0) {
      local_80[0] = (Stream *)(*(long *)(*plVar5 + -0x18) + (long)plVar5);
      pVar7 = std::
              _Rb_tree<Dashel::Stream*,Dashel::Stream*,std::_Identity<Dashel::Stream*>,std::less<Dashel::Stream*>,std::allocator<Dashel::Stream*>>
              ::_M_insert_unique<Dashel::Stream*>
                        ((_Rb_tree<Dashel::Stream*,Dashel::Stream*,std::_Identity<Dashel::Stream*>,std::less<Dashel::Stream*>,std::allocator<Dashel::Stream*>>
                          *)&this->dataStreams,local_80);
      (*this->_vptr_Hub[2])(this,*(long *)(*plVar5 + -0x18) + (long)plVar5,pVar7._8_8_);
    }
    uVar1 = *(undefined8 *)(*plVar5 + -0x18);
    if (local_60._M_dataplus._M_p != local_70 + 0x20) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
    return (int)plVar5 + (int)uVar1;
  }
  local_80[0] = (Stream *)local_70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,"Invalid protocol in target: ","");
  std::__cxx11::string::_M_append((char *)local_80,(ulong)local_60._M_dataplus._M_p);
  std::__cxx11::string::append((char *)local_80);
  StreamTypeRegistry::list_abi_cxx11_(&local_40,(StreamTypeRegistry *)streamTypeRegistry);
  std::__cxx11::string::_M_append((char *)local_80,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,(ulong)(local_40.field_2._M_allocated_capacity + 1));
  }
  pDVar6 = (DashelException *)__cxa_allocate_exception(0x20);
  DashelException::DashelException(pDVar6,InvalidTarget,0,(char *)local_80[0],(Stream *)0x0);
  __cxa_throw(pDVar6,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Stream* Hub::connect(const std::string& target)
	{
		std::string proto;
		size_t c = target.find_first_of(':');
		if (c == std::string::npos)
			throw DashelException(DashelException::InvalidTarget, 0, "No protocol specified in target.");
		proto = target.substr(0, c);
		// N.B. params = target.substr(c+1)

		SelectableStream* s(dynamic_cast<SelectableStream*>(streamTypeRegistry.create(proto, target, *this)));
		if (!s)
		{
			std::string r = "Invalid protocol in target: ";
			r += proto;
			r += ", known protocol are: ";
			r += streamTypeRegistry.list();
			throw DashelException(DashelException::InvalidTarget, 0, r.c_str());
		}

		/* The caller must have the stream lock held */

		streams.insert(s);
		if (proto != "tcpin")
		{
			dataStreams.insert(s);
			connectionCreated(s);
		}

		return s;
	}